

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

void __thiscall kj::CidrRange::zeroIrrelevantBits(CidrRange *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->bitCount;
  if (uVar1 < 0x80) {
    this->bits[uVar1 >> 3] = this->bits[uVar1 >> 3] & (byte)(0xff00 >> ((byte)uVar1 & 7));
    uVar2 = (ulong)(this->bitCount >> 3);
    memset(this->bits + uVar2 + 1,0,0xf - uVar2);
    return;
  }
  return;
}

Assistant:

void CidrRange::zeroIrrelevantBits() {
  // Mask out insignificant bits of partial byte.
  if (bitCount < 128) {
    bits[bitCount / 8] &= 0xff00 >> (bitCount % 8);

    // Zero the remaining bytes.
    size_t n = bitCount / 8 + 1;
    memset(bits + n, 0, sizeof(bits) - n);
  }
}